

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O0

QString * __thiscall
QMakeGlobals::cleanSpec(QMakeGlobals *this,QMakeCmdLineParserState *state,QString *spec)

{
  bool bVar1;
  ulong uVar2;
  QString *in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QString absRet;
  CaseSensitivity in_stack_ffffffffffffff9c;
  QString *this_00;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QLatin1Char local_b [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_00 = in_RDI;
  QDir::cleanPath((QString *)in_RDI);
  QLatin1Char::QLatin1Char(local_b,'/');
  QChar::QChar<QLatin1Char,_true>((QChar *)in_RDI,(QLatin1Char)(char)((ulong)this_00 >> 0x38));
  bVar1 = QString::contains(in_RDI,(QChar)(char16_t)((ulong)this_00 >> 0x30),
                            in_stack_ffffffffffffff9c);
  if (bVar1) {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    QMakeInternal::IoUtils::resolvePath(in_RCX,(QString *)CONCAT17(uVar3,in_stack_ffffffffffffffb0))
    ;
    uVar2 = QFile::exists((QString *)&local_28);
    if ((uVar2 & 1) != 0) {
      QString::operator=(this_00,(QString *)&local_28);
    }
    QString::~QString((QString *)0x30adef);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeGlobals::cleanSpec(QMakeCmdLineParserState &state, const QString &spec)
{
    QString ret = QDir::cleanPath(spec);
    if (ret.contains(QLatin1Char('/'))) {
        QString absRet = IoUtils::resolvePath(state.pwd, ret);
        if (QFile::exists(absRet))
            ret = absRet;
    }
    return ret;
}